

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O1

void NOPN2_Clock(ym3438_t *chip,Bit32s *buffer)

{
  Bit8u BVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  Bit8u *pBVar7;
  Bit8u BVar8;
  byte bVar9;
  byte bVar10;
  short sVar11;
  Bit16u BVar12;
  ushort uVar13;
  ulong uVar14;
  byte bVar15;
  short sVar16;
  uint uVar17;
  ulong uVar18;
  ushort uVar19;
  ulong uVar20;
  short sVar21;
  byte bVar22;
  uint uVar23;
  long lVar24;
  char cVar25;
  ushort uVar26;
  bool bVar27;
  bool bVar28;
  
  uVar6 = chip->cycles;
  uVar18 = (ulong)uVar6;
  chip->pg_read = chip->pg_read >> 1;
  chip->eg_read[1] = chip->eg_read[1] >> 1;
  chip->eg_cycle = chip->eg_cycle + '\x01';
  bVar9 = chip->mode_test_21[1];
  chip->lfo_inc = bVar9;
  if ((uVar18 == 1) && (chip->eg_quotient == 2)) {
    if (chip->eg_cycle_stop == '\0') {
      BVar8 = chip->eg_shift + '\x01';
    }
    else {
      BVar8 = '\0';
    }
    chip->eg_shift_lock = BVar8;
    chip->eg_timer_low_lock = (byte)chip->eg_timer & 3;
  }
  if ((int)uVar6 < 2) {
    if (uVar6 == 0) {
      bVar9 = chip->lfo_cnt;
      chip->lfo_pm = bVar9 >> 2;
      bVar15 = bVar9 & 0x3f;
      if ((bVar9 & 0x40) == 0) {
        bVar15 = bVar9 ^ 0x3f;
      }
      chip->lfo_am = bVar15 * '\x02';
    }
    else if (uVar6 == 1) {
      uVar3 = (uint)chip->eg_quotient + ((chip->eg_quotient + 1 & 0xffff) / 3) * -3 + 1;
      chip->eg_quotient = (Bit16u)uVar3;
      chip->eg_cycle = '\0';
      chip->eg_cycle_stop = '\x01';
      chip->eg_shift = '\0';
      uVar26 = (ushort)chip->eg_timer_inc | (ushort)((uVar3 & 0xffff) >> 1);
      goto LAB_0013d94d;
    }
  }
  else if (uVar6 == 2) {
    chip->pg_read = chip->pg_phase[0x15] & 0x3ff;
    chip->eg_read[1] = (uint)chip->eg_out[0];
  }
  else if (uVar6 == 0xd) {
    chip->eg_cycle = '\0';
    chip->eg_cycle_stop = '\x01';
    chip->eg_shift = '\0';
    uVar26 = (ushort)chip->eg_timer_inc;
LAB_0013d94d:
    uVar26 = uVar26 + chip->eg_timer;
    chip->eg_timer_inc = (byte)(uVar26 >> 0xc);
    chip->eg_timer = uVar26 & 0xfff;
  }
  else if (uVar6 == 0x17) {
    chip->lfo_inc = bVar9 | 1;
  }
  bVar9 = chip->eg_cycle;
  uVar4 = ~((uint)chip->mode_test_21[5] << (bVar9 & 0x1f)) & (uint)chip->eg_timer;
  chip->eg_timer = (Bit16u)uVar4;
  uVar3._0_1_ = chip->eg_custom_timer;
  uVar3._1_1_ = chip->eg_rate;
  uVar3._2_1_ = chip->eg_ksv;
  uVar3._3_1_ = chip->eg_inc;
  if (((chip->pin_test_in & uVar3 | uVar4 >> (bVar9 & 0x1f)) & (uint)chip->eg_cycle_stop) != 0) {
    chip->eg_shift = bVar9;
    chip->eg_cycle_stop = '\0';
  }
  chip->write_a_en = (chip->write_a & 3) == 1;
  bVar27 = (chip->write_d & 3) == 1;
  chip->write_d_en = bVar27;
  chip->write_a = chip->write_a * '\x02';
  chip->write_d = chip->write_d * '\x02';
  BVar8 = chip->write_busy;
  chip->busy = BVar8;
  bVar9 = chip->write_busy_cnt + BVar8;
  bVar28 = bVar9 < 0x20 || bVar27;
  if (BVar8 == '\0') {
    bVar28 = bVar27;
  }
  chip->write_busy = bVar28;
  chip->write_busy_cnt = bVar9 & 0x1f;
  bVar9 = chip->timer_a_overflow;
  bVar15 = bVar9;
  if (uVar6 == 2) {
    bVar28 = false;
    if (chip->timer_a_load_lock == '\0') {
      bVar28 = chip->timer_a_load != '\0';
    }
    bVar15 = bVar28 | bVar9;
    chip->timer_a_load_lock = chip->timer_a_load;
    bVar2 = bVar15;
    if (chip->mode_csm == '\0') {
      bVar2 = 0;
    }
    chip->mode_kon_csm = bVar2;
  }
  uVar26 = chip->ch_out[(ulong)(chip->timer_a_load_latch != '\0') + 9];
  chip->timer_a_load_latch = bVar15;
  if (((uVar6 == 1) && (chip->timer_a_load_lock != '\0')) || (chip->mode_test_21[2] != '\0')) {
    uVar26 = uVar26 + 1;
  }
  if (chip->timer_a_reset == '\0') {
    chip->timer_a_overflow_flag = chip->timer_a_overflow_flag | bVar9 & chip->timer_a_enable;
  }
  else {
    chip->timer_a_reset = '\0';
    chip->timer_a_overflow_flag = '\0';
  }
  chip->timer_a_overflow = (byte)(uVar26 >> 10);
  chip->timer_a_cnt = uVar26 & 0x3ff;
  bVar9 = chip->timer_b_overflow;
  bVar15 = bVar9;
  if (uVar6 == 2) {
    if (chip->timer_b_load_lock == '\0') {
      bVar28 = chip->timer_b_load != '\0';
    }
    else {
      bVar28 = false;
    }
    bVar15 = bVar28 | bVar9;
    chip->timer_b_load_lock = chip->timer_b_load;
  }
  uVar26 = *(ushort *)(chip->mode_test_21 + (ulong)(chip->timer_b_load_latch != '\0') * 4 + -0xd);
  chip->timer_b_load_latch = bVar15;
  if (uVar6 == 1) {
    chip->timer_b_subcnt = chip->timer_b_subcnt + '\x01';
  }
  if (((chip->timer_b_subcnt == 0x10) && (chip->timer_b_load_lock != '\0')) ||
     (chip->mode_test_21[2] != '\0')) {
    uVar26 = uVar26 + 1;
  }
  chip->timer_b_subcnt = chip->timer_b_subcnt & 0xf;
  if (chip->timer_b_reset == '\0') {
    chip->timer_b_overflow_flag = chip->timer_b_overflow_flag | bVar9 & chip->timer_b_enable;
  }
  else {
    chip->timer_b_reset = '\0';
    chip->timer_b_overflow_flag = '\0';
  }
  chip->timer_b_overflow = (Bit8u)(uVar26 >> 8);
  chip->timer_b_cnt = uVar26 & 0xff;
  uVar3 = chip->channel;
  uVar20 = (ulong)uVar3;
  chip->eg_kon_latch[uVar18] = chip->mode_kon[uVar18];
  chip->eg_kon_csm[uVar18] = '\0';
  if ((uVar20 == 2) && (chip->mode_kon_csm != '\0')) {
    chip->eg_kon_latch[uVar18] = '\x01';
    chip->eg_kon_csm[uVar18] = '\x01';
  }
  if (uVar6 == chip->mode_kon_channel) {
    chip->mode_kon[uVar20] = chip->mode_kon_operator[0];
    chip->mode_kon[uVar3 + 0xc] = chip->mode_kon_operator[1];
    chip->mode_kon[uVar3 + 6] = chip->mode_kon_operator[2];
    chip->mode_kon[uVar3 + 0x12] = chip->mode_kon_operator[3];
  }
  uVar4 = chip->cycles;
  uVar18 = (ulong)uVar4;
  bVar9 = chip->mode_test_2c[5];
  chip->ch_read = chip->ch_lock;
  uVar17 = uVar3 + (uVar18 < 0xc);
  uVar5 = uVar4 & 3;
  if (uVar5 == 0) {
    if (bVar9 == 0) {
      chip->ch_lock = chip->ch_out[uVar17];
    }
    chip->ch_lock_l = chip->pan_l[uVar17];
    chip->ch_lock_r = chip->pan_r[uVar17];
  }
  if ((uVar4 & 0xfffffffc) == 4) {
    if (chip->dacen == '\0' && bVar9 == 0) goto LAB_0013dc9f;
LAB_0013dcac:
    uVar26 = (chip->dacdata & 0xffU) - (chip->dacdata & 0x100U);
  }
  else {
    if (bVar9 != 0) goto LAB_0013dcac;
LAB_0013dc9f:
    uVar26 = chip->ch_lock;
  }
  chip->mol = 0;
  chip->mor = 0;
  if ((chip->chip_type & 1) == 0) {
    if ((chip->ch_lock_l != '\0') && (uVar5 != 0 || bVar9 != 0)) {
      chip->mol = uVar26;
    }
    if (chip->ch_lock_r != '\0' && (uVar5 != 0 || bVar9 != 0)) goto LAB_0013dd5c;
  }
  else {
    sVar16 = uVar26 + -((short)~uVar26 >> 0xf);
    sVar21 = -((short)~uVar26 >> 0xf) + (short)(char)(uVar26 >> 8);
    sVar11 = sVar21;
    if (bVar9 != 0) {
      sVar11 = sVar16;
    }
    if (uVar5 == 3) {
      sVar11 = sVar16;
    }
    sVar16 = sVar21;
    if (chip->ch_lock_l != '\0') {
      sVar16 = sVar11;
    }
    if (chip->ch_lock_r == '\0') {
      sVar11 = sVar21;
    }
    chip->mor = sVar11;
    chip->mol = sVar16 * 3;
    uVar26 = sVar11 * 3;
LAB_0013dd5c:
    chip->mor = uVar26;
  }
  uVar5 = (uVar4 + 0x12) % 0x18;
  uVar26 = (ushort)bVar9;
  if (*(int *)(((ulong)uVar5 / 6) * 0xc0 + 0x174810 + (ulong)chip->connect[uVar20] * 4) != 0 &&
      bVar9 == 0) {
    uVar26 = (ushort)((uint)(int)chip->fm_out[uVar5] >> 5);
  }
  sVar11 = chip->ch_acc[uVar20];
  if (uVar5 < 6 || bVar9 != 0) {
    chip->ch_out[uVar20] = sVar11;
  }
  uVar19 = 0;
  sVar16 = 0;
  if (bVar9 != 0) {
    sVar16 = sVar11;
  }
  if (5 < uVar5) {
    sVar16 = sVar11;
  }
  sVar11 = -0x100;
  if (-0x100 < (short)(uVar26 + sVar16)) {
    sVar11 = uVar26 + sVar16;
  }
  if (0xfe < sVar11) {
    sVar11 = 0xff;
  }
  chip->ch_acc[uVar20] = sVar11;
  uVar17 = (uVar4 + 6) % 0x18;
  uVar14 = (ulong)chip->connect[uVar20];
  lVar24 = ((ulong)uVar17 / 6) * 0xc0;
  if (fm_algorithm[(ulong)uVar17 / 6][0][uVar14] != 0) {
    uVar19 = chip->fm_op1[uVar20][0];
  }
  if (*(int *)(lVar24 + 0x174790 + uVar14 * 4) == 0) {
    uVar26 = 0;
  }
  else {
    uVar26 = chip->fm_op1[uVar20][1];
  }
  if (*(int *)(lVar24 + 0x1747b0 + uVar14 * 4) != 0) {
    uVar26 = uVar26 | chip->fm_op2[uVar20];
  }
  if (*(int *)(lVar24 + 0x1747d0 + uVar14 * 4) != 0) {
    uVar19 = uVar19 | chip->fm_out[uVar5];
  }
  if (*(int *)(lVar24 + 0x1747f0 + uVar14 * 4) != 0) {
    uVar26 = uVar26 | chip->fm_out[uVar5];
  }
  if (uVar17 < 6) {
    BVar12 = 0;
    if (chip->fb[uVar20] != '\0') {
      BVar12 = (Bit16u)((int)(short)(uVar26 + uVar19) >> (10 - chip->fb[uVar20] & 0x1f));
    }
  }
  else {
    BVar12 = (Bit16u)((uint)(int)(short)(uVar26 + uVar19) >> 1);
  }
  chip->fm_mod[uVar17] = BVar12;
  if (uVar5 < 6) {
    chip->fm_op1[uVar20][1] = chip->fm_op1[uVar20][0];
    chip->fm_op1[uVar20][0] = chip->fm_out[uVar5];
  }
  if (uVar5 - 0xc < 6) {
    chip->fm_op2[uVar20] = chip->fm_out[uVar5];
  }
  uVar17 = ((uVar4 + 0x13) / 0x18) * -0x18 + uVar4 + 0x13;
  uVar26 = (short)(chip->pg_phase[uVar17] >> 10) + chip->fm_mod[uVar17];
  uVar5 = ~(uint)uVar26;
  if ((uVar26 & 0x100) == 0) {
    uVar5 = (uint)uVar26;
  }
  uVar5 = (uint)(ushort)(chip->eg_out[uVar17] * 4 + logsinrom[uVar5 & 0xff]);
  if (0x1ffe < uVar5) {
    uVar5 = 0x1fff;
  }
  uVar13 = (ushort)chip->mode_test_21[4] << 0xd ^
           (ushort)(((uint)exprom[~uVar5 & 0xff] << 2 | 0x1000) >> ((byte)(uVar5 >> 8) & 0x1f));
  uVar19 = -uVar13;
  if ((uVar26 & 0x200) == 0) {
    uVar19 = uVar13;
  }
  chip->fm_out[uVar17] = (uVar19 & 0x1fff) - (uVar19 & 0x2000);
  uVar5 = ((uVar4 + 0x14) / 0x18) * -0x18 + uVar4 + 0x14;
  if (chip->pg_reset[uVar5] != '\0') {
    chip->pg_inc[uVar5] = 0;
  }
  if ((chip->pg_reset[uVar17] != '\0') || (chip->mode_test_21[3] != '\0')) {
    chip->pg_phase[uVar17] = 0;
  }
  chip->pg_phase[uVar17] = chip->pg_phase[uVar17] + chip->pg_inc[uVar17] & 0xfffff;
  bVar2 = chip->lfo_pm & 0xf;
  bVar9 = chip->pms[uVar20];
  bVar15 = bVar2 ^ 0xf;
  if (bVar2 < 8) {
    bVar15 = bVar2;
  }
  bVar2 = chip->dt[uVar18];
  uVar5 = 0;
  bVar22 = bVar2 & 3;
  if (bVar22 != 0) {
    bVar10 = 0x1c;
    if (chip->pg_kcode < 0x1c) {
      bVar10 = chip->pg_kcode;
    }
    uVar5 = pg_detune[((bVar22 == 3) + (bVar10 >> 2)) * '\x04' + 0x24 & 4 | bVar10 & 3] >>
            (9 - ((byte)((bVar2 & 2 | bVar22 == 3) + (bVar10 >> 2) + 9) >> 1) & 0x1f) & 0xff;
  }
  uVar26 = chip->pg_fnum >> 4;
  bVar22 = 0;
  if (5 < bVar9) {
    bVar22 = bVar9 - 5;
  }
  uVar23 = ((uint)(uVar26 >> ((byte)pg_lfo_sh2[bVar9][bVar15] & 0x1f)) +
            (uint)(uVar26 >> ((byte)pg_lfo_sh1[bVar9][bVar15] & 0x1f)) << (bVar22 & 0x1f)) >> 2;
  uVar17 = -uVar23;
  if ((chip->lfo_pm & 0x10) == 0) {
    uVar17 = uVar23;
  }
  uVar23 = -uVar5;
  if ((bVar2 & 4) == 0) {
    uVar23 = uVar5;
  }
  chip->pg_inc[uVar18] =
       (uint)chip->multi[uVar18] *
       (uVar23 + (((uVar17 + (uint)chip->pg_fnum * 2 & 0xfff) << (chip->pg_block & 0x1f)) >> 2) &
       0x1ffff) >> 1 & 0xfffff;
  uVar5 = (uVar4 + 0x16) % 0x18;
  BVar8 = chip->eg_kon_latch[uVar5];
  bVar9 = chip->eg_state[uVar5];
  BVar1 = chip->eg_kon[uVar5];
  chip->eg_read[0] = (uint)chip->eg_read_inc;
  bVar15 = chip->eg_inc;
  chip->eg_read_inc = bVar15 != 0;
  if (BVar1 == '\0' && BVar8 != '\0') {
    chip->pg_reset[uVar5] = '\x01';
    bVar28 = false;
  }
  else {
    chip->pg_reset[uVar5] = chip->eg_ssg_pgrst_latch[uVar5] != '\0';
    if (BVar1 == '\0') {
      bVar28 = true;
    }
    else {
      bVar28 = chip->eg_ssg_repeat_latch[uVar5] == '\0';
    }
  }
  uVar26 = chip->eg_level[uVar5];
  uVar19 = 0x200 - uVar26 & 0x3ff;
  if (chip->eg_ssg_inv[uVar5] == '\0') {
    uVar19 = uVar26;
  }
  if (BVar1 == '\0') {
    uVar19 = uVar26;
  }
  if (BVar8 != '\0') {
    uVar19 = uVar26;
  }
  cVar25 = (~uVar19 & 0x3f0) == 0;
  if (chip->eg_ssg_enable[uVar5] != '\0') {
    cVar25 = (char)((int)(short)uVar19 >> 9);
  }
  if (bVar28) {
    bVar22 = bVar9;
    if (bVar9 - 2 < 2) {
LAB_0013e381:
      if (bVar15 == 0 || cVar25 != '\0') {
LAB_0013e393:
        sVar11 = 0;
      }
      else {
        sVar11 = (short)(1 << (bVar15 - 1 & 0x1f));
        if (chip->eg_ssg_enable[uVar5] != '\0') {
          sVar11 = (short)(4 << (bVar15 - 1 & 0x1f));
        }
      }
    }
    else {
      if (bVar9 != 1) {
        if (bVar9 == 0) {
          if (uVar19 == 0) {
            bVar22 = 1;
            goto LAB_0013eb84;
          }
          if (bVar15 != 0) {
            sVar11 = 0;
            if ((BVar8 != '\0') && (sVar11 = 0, chip->eg_ratemax == '\0')) {
              sVar11 = (short)((uint)((int)(short)~uVar19 << (bVar15 & 0x1f)) >> 5);
            }
            goto LAB_0013e3b4;
          }
        }
        goto LAB_0013e393;
      }
      if ((uint)chip->eg_sl[1] * 2 != (int)(short)uVar19 >> 4) goto LAB_0013e381;
      bVar22 = 2;
LAB_0013eb84:
      sVar11 = 0;
    }
LAB_0013e3b4:
    bVar2 = 3;
    if (BVar8 != '\0') {
      bVar2 = bVar22;
    }
  }
  else if (chip->eg_ratemax == '\0') {
    sVar11 = 0;
    bVar2 = 0;
    if ((((bVar9 == 0) && (uVar19 != 0)) && (BVar8 != '\0')) && (sVar11 = 0, bVar15 != 0)) {
      sVar11 = (short)((uint)((int)(short)~uVar19 << (bVar15 & 0x1f)) >> 5);
      bVar2 = 0;
    }
  }
  else {
    uVar19 = 0;
    bVar2 = 0;
    sVar11 = 0;
  }
  if (chip->eg_kon_csm[uVar5] != '\0') {
    uVar19 = uVar19 | (ushort)chip->eg_tl[1] << 3;
  }
  bVar15 = bVar2;
  uVar26 = uVar19;
  if ((bVar28) && (chip->eg_ssg_hold_up_latch[uVar5] == '\0')) {
    uVar26 = 0x3ff;
    if (bVar9 == 0 || cVar25 == '\0') {
      uVar26 = uVar19;
    }
    bVar15 = 3;
    if (bVar9 == 0 || cVar25 == '\0') {
      bVar15 = bVar2;
    }
  }
  chip->eg_kon[uVar5] = BVar8;
  chip->eg_level[uVar5] = uVar26 + sVar11 & 0x3ff;
  chip->eg_state[uVar5] = bVar15;
  uVar4 = (uVar4 + 0x17) % 0x18;
  uVar26 = 0x200 - chip->eg_level[uVar4];
  if (chip->eg_ssg_inv[uVar4] == '\0') {
    uVar26 = chip->eg_level[uVar4];
  }
  uVar19 = 0;
  if (chip->mode_test_21[5] == '\0') {
    uVar19 = uVar26 & 0x3ff;
  }
  uVar19 = chip->eg_lfo_am + uVar19;
  if ((uVar3 != 3) || (chip->mode_csm == '\0')) {
    uVar19 = uVar19 + (ushort)chip->eg_tl[0] * 8;
  }
  if (0x3fe < uVar19) {
    uVar19 = 0x3ff;
  }
  chip->eg_out[uVar4] = uVar19;
  bVar15 = 0;
  chip->eg_ssg_pgrst_latch[uVar18] = '\0';
  chip->eg_ssg_repeat_latch[uVar18] = '\0';
  chip->eg_ssg_hold_up_latch[uVar18] = '\0';
  bVar9 = chip->ssg_eg[uVar18];
  if ((bVar9 & 8) != 0) {
    bVar15 = chip->eg_ssg_dir[uVar18];
    if ((*(byte *)((long)chip->eg_level + uVar18 * 2 + 1) & 2) != 0) {
      if ((bVar9 & 3) == 0) {
        chip->eg_ssg_pgrst_latch[uVar18] = '\x01';
      }
      if ((bVar9 & 1) == 0) {
        chip->eg_ssg_repeat_latch[uVar18] = '\x01';
      }
      bVar15 = 1;
      if ((bVar9 & 3) != 3) {
        bVar15 = chip->eg_ssg_dir[uVar18] ^ (bVar9 & 3) == 2;
      }
    }
    if ((chip->eg_kon_latch[uVar18] != '\0') && (((bVar9 & 7) == 5 || ((bVar9 & 7) == 3)))) {
      chip->eg_ssg_hold_up_latch[uVar18] = '\x01';
    }
    bVar15 = bVar15 & chip->eg_kon[uVar18];
  }
  chip->eg_ssg_dir[uVar18] = bVar15;
  bVar22 = bVar9 >> 3 & 1;
  chip->eg_ssg_enable[uVar18] = bVar22;
  bVar2 = chip->eg_kon[uVar18];
  chip->eg_ssg_inv[uVar18] = (bVar9 >> 2 & bVar22 ^ bVar15) & bVar2;
  bVar15 = chip->eg_rate * '\x02' + chip->eg_ksv;
  bVar9 = 0x3f;
  if (bVar15 < 0x3f) {
    bVar9 = bVar15;
  }
  if ((chip->eg_rate == '\0') || (chip->eg_quotient != 2)) {
LAB_0013e5e3:
    bVar15 = 0;
  }
  else if (bVar15 < 0x30) {
    bVar22 = (bVar9 >> 2) + chip->eg_shift_lock & 0xf;
    bVar15 = bVar9;
    if (bVar22 != 0xe) {
      if (bVar22 != 0xd) {
        if (bVar22 != 0xc) goto LAB_0013e5e3;
        bVar15 = 1;
        goto LAB_0013e5e5;
      }
      bVar15 = bVar9 >> 1;
    }
    bVar15 = bVar15 & 1;
  }
  else {
    bVar22 = ((bVar9 >> 2) +
             (char)*(undefined4 *)
                    ((long)eg_stephi[0] +
                    (ulong)chip->eg_timer_low_lock * 4 + (ulong)((bVar9 & 3) << 4))) - 0xb;
    bVar15 = 4;
    if (bVar22 < 4) {
      bVar15 = bVar22;
    }
  }
LAB_0013e5e5:
  chip->eg_inc = bVar15;
  chip->eg_ratemax = (~bVar9 & 0x3e) == 0;
  BVar8 = chip->eg_state[uVar18];
  if (bVar2 == 0) {
    BVar1 = chip->eg_kon_latch[uVar18];
  }
  else {
    BVar1 = chip->eg_ssg_repeat_latch[uVar18];
  }
  if (BVar1 != '\0') {
    BVar8 = '\0';
  }
  switch(BVar8) {
  case '\0':
    BVar8 = chip->ar[uVar18];
    break;
  case '\x01':
    BVar8 = chip->dr[uVar18];
    break;
  case '\x02':
    BVar8 = chip->sr[uVar18];
    break;
  case '\x03':
    BVar8 = chip->rr[uVar18] * '\x02' + '\x01';
    break;
  default:
    goto switchD_0013e624_default;
  }
  chip->eg_rate = BVar8;
switchD_0013e624_default:
  chip->eg_ksv = chip->pg_kcode >> ((chip->ks[uVar18] ^ 3) & 0x1f);
  if (chip->am[uVar18] == '\0') {
    bVar9 = 0;
  }
  else {
    bVar9 = chip->lfo_am >> ("\a\x03\x01"[chip->ams[uVar20]] & 0x1f);
  }
  chip->eg_lfo_am = bVar9;
  BVar8 = chip->eg_sl[0];
  chip->eg_tl[1] = chip->eg_tl[0];
  chip->eg_tl[0] = chip->tl[uVar18];
  chip->eg_sl[1] = BVar8;
  chip->eg_sl[0] = chip->sl[uVar18];
  if (chip->mode_ch3 == '\0') {
LAB_0013e717:
    uVar6 = chip->channel + ((chip->channel + 1) / 6) * -6 + 1;
    chip->pg_fnum = chip->fnum[uVar6];
    pBVar7 = chip->kcode + uVar6;
    chip->pg_block = chip->block[uVar6];
  }
  else {
    uVar6 = uVar6 - 1 >> 1 | (uint)((uVar6 - 1 & 1) != 0) << 0x1f;
    if (uVar6 == 6) {
      chip->pg_fnum = chip->fnum_3ch[2];
      chip->pg_block = chip->block_3ch[2];
      pBVar7 = chip->kcode_3ch + 2;
    }
    else if (uVar6 == 3) {
      chip->pg_fnum = chip->fnum_3ch[0];
      chip->pg_block = chip->block_3ch[0];
      pBVar7 = chip->kcode_3ch;
    }
    else {
      if (uVar6 != 0) goto LAB_0013e717;
      chip->pg_fnum = chip->fnum_3ch[1];
      chip->pg_block = chip->block_3ch[1];
      pBVar7 = chip->kcode_3ch + 1;
    }
  }
  chip->pg_kcode = *pBVar7;
  if ((lfo_samples_per_step[chip->lfo_freq] & ~(uint)chip->lfo_quotient) == 0) {
    chip->lfo_quotient = '\0';
    chip->lfo_cnt = chip->lfo_cnt + '\x01';
  }
  else {
    chip->lfo_quotient = chip->lfo_quotient + chip->lfo_inc;
  }
  chip->lfo_cnt = chip->lfo_cnt & chip->lfo_en;
  uVar6 = chip->cycles;
  if (chip->write_fm_data != '\0') {
    uVar3 = chip->channel;
    uVar4 = uVar6 % 0xc;
    uVar26 = chip->address;
    if (op_offset[uVar4] == (uVar26 & 0x107)) {
      uVar5 = uVar4 + 0xc;
      if ((uVar26 & 8) == 0) {
        uVar5 = uVar4;
      }
      switch((uVar26 & 0xf0) - 0x30 >> 4) {
      case 0:
        bVar9 = chip->data;
        bVar15 = bVar9 & 0xf;
        BVar8 = '\x01';
        if (bVar15 != 0) {
          BVar8 = bVar15 * '\x02';
        }
        chip->multi[uVar5] = BVar8;
        chip->dt[uVar5] = bVar9 >> 4 & 7;
        break;
      case 1:
        chip->tl[uVar5] = chip->data & 0x7f;
        break;
      case 2:
        bVar9 = chip->data;
        chip->ar[uVar5] = bVar9 & 0x1f;
        chip->ks[uVar5] = bVar9 >> 6;
        break;
      case 3:
        bVar9 = chip->data;
        chip->dr[uVar5] = bVar9 & 0x1f;
        chip->am[uVar5] = bVar9 >> 7;
        break;
      case 4:
        chip->sr[uVar5] = chip->data & 0x1f;
        break;
      case 5:
        bVar9 = chip->data;
        chip->rr[uVar5] = bVar9 & 0xf;
        bVar9 = bVar9 >> 4;
        chip->sl[uVar5] = bVar9 + 1 & 0x10 | bVar9;
        break;
      case 6:
        chip->ssg_eg[uVar5] = chip->data & 0xf;
      }
    }
    if (ch_offset[uVar3] == (uVar26 & 0x103)) {
      switch((uVar26 & 0xfc) - 0xa0 >> 2) {
      case 0:
        bVar9 = chip->reg_a4;
        chip->fnum[uVar3] = (bVar9 & 7) << 8 | (ushort)chip->data;
        bVar9 = bVar9 >> 3 & 7;
        chip->block[uVar3] = bVar9;
        chip->kcode[uVar3] = bVar9 << 2 | (byte)fn_note[chip->fnum[uVar3] >> 7];
        break;
      case 1:
        chip->reg_a4 = chip->data;
        break;
      case 2:
        bVar9 = chip->reg_ac;
        chip->fnum_3ch[uVar3] = (bVar9 & 7) << 8 | (ushort)chip->data;
        bVar9 = bVar9 >> 3 & 7;
        chip->block_3ch[uVar3] = bVar9;
        chip->kcode_3ch[uVar3] = bVar9 << 2 | (byte)fn_note[chip->fnum_3ch[uVar3] >> 7];
        break;
      case 3:
        chip->reg_ac = chip->data;
        break;
      case 4:
        bVar9 = chip->data;
        chip->connect[uVar3] = bVar9 & 7;
        chip->fb[uVar3] = bVar9 >> 3 & 7;
        break;
      case 5:
        bVar9 = chip->data;
        chip->pms[uVar3] = bVar9 & 7;
        chip->ams[uVar3] = bVar9 >> 4 & 3;
        chip->pan_l[uVar3] = bVar9 >> 7;
        chip->pan_r[uVar3] = bVar9 >> 6 & 1;
      }
    }
  }
  BVar8 = chip->write_a_en;
  if (BVar8 == '\0') {
    if (chip->write_d_en == '\0') goto LAB_0013ed49;
  }
  else {
    chip->write_fm_data = '\0';
  }
  if ((chip->write_fm_address != '\0') && (chip->write_d_en != '\0')) {
    chip->write_fm_data = '\x01';
  }
  if (BVar8 != '\0') {
    bVar28 = (chip->write_data & 0xf0) != 0;
    if (bVar28) {
      chip->address = chip->write_data;
    }
    chip->write_fm_address = bVar28;
  }
  if (((chip->write_d_en != '\0') && (uVar26 = chip->write_data, (uVar26 >> 8 & 1) == 0)) &&
     (chip->write_fm_mode_a - 0x21 < 0xc)) {
    bVar9 = (byte)uVar26;
    switch((uint)chip->write_fm_mode_a) {
    case 0x21:
      lVar24 = 0;
      do {
        chip->mode_test_21[lVar24] = (uVar26 >> ((uint)lVar24 & 0x1f) & 1) != 0;
        lVar24 = lVar24 + 1;
      } while (lVar24 != 8);
      break;
    case 0x22:
      bVar15 = 0x7f;
      if ((uVar26 & 8) == 0) {
        bVar15 = bVar9 & 8;
      }
      chip->lfo_en = bVar15;
      chip->lfo_freq = bVar9 & 7;
      break;
    case 0x24:
      chip->timer_a_reg = (chip->timer_a_reg & 3) + (uVar26 & 0xff) * 4;
      break;
    case 0x25:
      chip->timer_a_reg = uVar26 & 3 | chip->timer_a_reg & 0x3fc;
      break;
    case 0x26:
      chip->timer_b_reg = uVar26 & 0xff;
      break;
    case 0x27:
      chip->mode_ch3 = bVar9 >> 6;
      chip->mode_csm = bVar9 >> 6 == 2;
      chip->timer_a_load = bVar9 & 1;
      chip->timer_a_enable = bVar9 >> 2 & 1;
      chip->timer_a_reset = bVar9 >> 4 & 1;
      chip->timer_b_load = bVar9 >> 1 & 1;
      chip->timer_b_enable = bVar9 >> 3 & 1;
      chip->timer_b_reset = bVar9 >> 5 & 1;
      break;
    case 0x28:
      lVar24 = 0;
      do {
        chip->mode_kon_operator[lVar24] = (uVar26 >> ((byte)((byte)lVar24 | 4) & 0x1f) & 1) != 0;
        lVar24 = lVar24 + 1;
      } while (lVar24 != 4);
      uVar3 = uVar26 & 3;
      if (uVar3 == 3) {
        chip->mode_kon_channel = 0xff;
      }
      else {
        chip->mode_kon_channel = ((byte)((int)((uint)uVar26 << 0x1d) >> 0x1f) & 3) + (char)uVar3;
      }
      break;
    case 0x2a:
      chip->dacdata = (chip->dacdata & 1U) + uVar26 * 2 ^ 0x100;
      break;
    case 0x2b:
      chip->dacen = (Bit8u)(uVar26 >> 7);
      break;
    case 0x2c:
      lVar24 = 0;
      do {
        chip->mode_test_2c[lVar24] = (uVar26 >> ((uint)lVar24 & 0x1f) & 1) != 0;
        lVar24 = lVar24 + 1;
      } while (lVar24 != 8);
      chip->dacdata = (ushort)chip->mode_test_2c[3] | chip->dacdata & 0x1feU;
      if (chip->mode_test_2c[7] == '\0') {
        bVar28 = chip->mode_test_2c[6] != '\0';
      }
      else {
        bVar28 = false;
      }
      chip->eg_custom_timer = bVar28;
    }
  }
  if (BVar8 != '\0') {
    chip->write_fm_mode_a = chip->write_data & 0x1ff;
  }
LAB_0013ed49:
  if (chip->write_fm_data != '\0') {
    chip->data = (Bit8u)chip->write_data;
  }
  uVar6 = (uVar6 + 1) % 0x18;
  chip->cycles = uVar6;
  chip->channel = uVar6 % 6;
  *buffer = (int)chip->mol;
  buffer[1] = (int)chip->mor;
  if (chip->status_time != 0) {
    chip->status_time = chip->status_time - 1;
  }
  return;
}

Assistant:

void NOPN2_Clock(ym3438_t *chip, Bit32s *buffer)
{
    Bit32u slot = chip->cycles;
    chip->lfo_inc = chip->mode_test_21[1];
    chip->pg_read >>= 1;
    chip->eg_read[1] >>= 1;
    chip->eg_cycle++;
    /* Lock envelope generator timer value */
    if (chip->cycles == 1 && chip->eg_quotient == 2)
    {
        if (chip->eg_cycle_stop)
        {
            chip->eg_shift_lock = 0;
        }
        else
        {
            chip->eg_shift_lock = chip->eg_shift + 1;
        }
        chip->eg_timer_low_lock = chip->eg_timer & 0x03;
    }
    /* Cycle specific functions */
    switch (chip->cycles)
    {
    case 0:
        chip->lfo_pm = chip->lfo_cnt >> 2;
        if (chip->lfo_cnt & 0x40)
        {
            chip->lfo_am = chip->lfo_cnt & 0x3f;
        }
        else
        {
            chip->lfo_am = chip->lfo_cnt ^ 0x3f;
        }
        chip->lfo_am <<= 1;
        break;
    case 1:
        chip->eg_quotient++;
        chip->eg_quotient %= 3;
        chip->eg_cycle = 0;
        chip->eg_cycle_stop = 1;
        chip->eg_shift = 0;
        chip->eg_timer_inc |= chip->eg_quotient >> 1;
        chip->eg_timer = chip->eg_timer + chip->eg_timer_inc;
        chip->eg_timer_inc = chip->eg_timer >> 12;
        chip->eg_timer &= 0xfff;
        break;
    case 2:
        chip->pg_read = chip->pg_phase[21] & 0x3ff;
        chip->eg_read[1] = chip->eg_out[0];
        break;
    case 13:
        chip->eg_cycle = 0;
        chip->eg_cycle_stop = 1;
        chip->eg_shift = 0;
        chip->eg_timer = chip->eg_timer + chip->eg_timer_inc;
        chip->eg_timer_inc = chip->eg_timer >> 12;
        chip->eg_timer &= 0xfff;
        break;
    case 23:
        chip->lfo_inc |= 1;
        break;
    }
    chip->eg_timer &= ~(chip->mode_test_21[5] << chip->eg_cycle);
    if (((chip->eg_timer >> chip->eg_cycle) | (chip->pin_test_in & chip->eg_custom_timer)) & chip->eg_cycle_stop)
    {
        chip->eg_shift = chip->eg_cycle;
        chip->eg_cycle_stop = 0;
    }

    NOPN2_DoIO(chip);

    NOPN2_DoTimerA(chip);
    NOPN2_DoTimerB(chip);
    NOPN2_KeyOn(chip);

    NOPN2_ChOutput(chip);
    NOPN2_ChGenerate(chip);

    NOPN2_FMPrepare(chip);
    NOPN2_FMGenerate(chip);

    NOPN2_PhaseGenerate(chip);
    NOPN2_PhaseCalcIncrement(chip);

    NOPN2_EnvelopeADSR(chip);
    NOPN2_EnvelopeGenerate(chip);
    NOPN2_EnvelopeSSGEG(chip);
    NOPN2_EnvelopePrepare(chip);

    /* Prepare fnum & block */
    if (chip->mode_ch3)
    {
        /* Channel 3 special mode */
        switch (slot)
        {
        case 1: /* OP1 */
            chip->pg_fnum = chip->fnum_3ch[1];
            chip->pg_block = chip->block_3ch[1];
            chip->pg_kcode = chip->kcode_3ch[1];
            break;
        case 7: /* OP3 */
            chip->pg_fnum = chip->fnum_3ch[0];
            chip->pg_block = chip->block_3ch[0];
            chip->pg_kcode = chip->kcode_3ch[0];
            break;
        case 13: /* OP2 */
            chip->pg_fnum = chip->fnum_3ch[2];
            chip->pg_block = chip->block_3ch[2];
            chip->pg_kcode = chip->kcode_3ch[2];
            break;
        case 19: /* OP4 */
        default:
            chip->pg_fnum = chip->fnum[(chip->channel + 1) % 6];
            chip->pg_block = chip->block[(chip->channel + 1) % 6];
            chip->pg_kcode = chip->kcode[(chip->channel + 1) % 6];
            break;
        }
    }
    else
    {
        chip->pg_fnum = chip->fnum[(chip->channel + 1) % 6];
        chip->pg_block = chip->block[(chip->channel + 1) % 6];
        chip->pg_kcode = chip->kcode[(chip->channel + 1) % 6];
    }

    NOPN2_UpdateLFO(chip);
    NOPN2_DoRegWrite(chip);
    chip->cycles = (chip->cycles + 1) % 24;
    chip->channel = chip->cycles % 6;

    buffer[0] = chip->mol;
    buffer[1] = chip->mor;

    if (chip->status_time)
        chip->status_time--;
}